

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HubContext.h
# Opt level: O0

value_type __thiscall SL::WS_LITE::HubContext::getnextContext(HubContext *this)

{
  __int_type _Var1;
  size_type sVar2;
  reference pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __atomic_base<unsigned_long> *in_RSI;
  value_type vVar4;
  HubContext *this_local;
  
  _Var1 = std::__atomic_base<unsigned_long>::operator++(in_RSI,0);
  sVar2 = std::
          vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
          ::size((vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
                  *)(in_RSI + 1));
  pvVar3 = std::
           vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
           ::operator[]((vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
                         *)(in_RSI + 1),_Var1 % sVar2);
  std::shared_ptr<SL::WS_LITE::ThreadContext>::shared_ptr
            ((shared_ptr<SL::WS_LITE::ThreadContext> *)this,pvVar3);
  vVar4.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  vVar4.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_type)
         vVar4.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto getnextContext() { return ThreadContexts[(m_nextService++ % ThreadContexts.size())]; }